

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom64.cc
# Opt level: O3

int g80_atom64_prep(hwtest_ctx *ctx)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (((ctx->chipset).card_type == 0x50) && (0x9f < (ctx->chipset).chipset)) {
    if ((*(uint *)((long)nva_cards[ctx->cnum]->bar0 + 0x200) >> 0x14 & 1) == 0) {
      puts("Mem controller not up.");
      iVar2 = 2;
    }
    else {
      iVar1 = g80_gr_prep(ctx);
      iVar2 = 3;
      if (iVar1 == 0) {
        iVar2 = g80_gr_compute_prep(ctx);
        iVar2 = (uint)(iVar2 != 0) * 2 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int g80_atom64_prep(struct hwtest_ctx *ctx) {
	if (ctx->chipset.card_type != 0x50)
		return HWTEST_RES_NA;
	if (ctx->chipset.chipset < 0xa0)
		return HWTEST_RES_NA;
	if (!(nva_rd32(ctx->cnum, 0x200) & 1 << 20)) {
		printf("Mem controller not up.\n");
		return HWTEST_RES_UNPREP;
	}
	if (g80_gr_prep(ctx))
		return HWTEST_RES_FAIL;
	if (g80_gr_compute_prep(ctx))
		return HWTEST_RES_FAIL;
	return HWTEST_RES_PASS;
}